

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t __thiscall icu_63::MessagePattern::skipDouble(MessagePattern *this,int32_t index)

{
  char16_t cVar1;
  int32_t iVar2;
  int32_t iStack_14;
  UChar c;
  int32_t msgLength;
  int32_t index_local;
  MessagePattern *this_local;
  
  iVar2 = UnicodeString::length(&this->msg);
  iStack_14 = index;
  while (((iStack_14 < iVar2 &&
          ((((cVar1 = UnicodeString::charAt(&this->msg,iStack_14), 0x2f < (ushort)cVar1 ||
             (cVar1 == L'+')) || (cVar1 == L'-')) || (cVar1 == L'.')))) &&
         ((((ushort)cVar1 < 0x3a || (cVar1 == L'e')) || ((cVar1 == L'E' || (cVar1 == L'∞'))))))) {
    iStack_14 = iStack_14 + 1;
  }
  return iStack_14;
}

Assistant:

int32_t
MessagePattern::skipDouble(int32_t index) {
    int32_t msgLength=msg.length();
    while(index<msgLength) {
        UChar c=msg.charAt(index);
        // U+221E: Allow the infinity symbol, for ChoiceFormat patterns.
        if((c<0x30 && c!=u_plus && c!=u_minus && c!=u_dot) || (c>0x39 && c!=u_e && c!=u_E && c!=0x221e)) {
            break;
        }
        ++index;
    }
    return index;
}